

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateGetPrototype
          (ServiceGenerator *this,RequestOrResponse which,Printer *printer)

{
  int iVar1;
  int iVar2;
  cpp *local_c8;
  char *local_a0;
  string local_98;
  cpp *local_78;
  Descriptor *type;
  MethodDescriptor *method;
  int i;
  undefined1 local_58 [8];
  Formatter format;
  Printer *printer_local;
  RequestOrResponse which_local;
  ServiceGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_58,printer,&this->vars_);
  if (which == REQUEST) {
    Formatter::operator()<>
              ((Formatter *)local_58,
               "const ::$proto_ns$::Message& $classname$::GetRequestPrototype(\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_58,
               "const ::$proto_ns$::Message& $classname$::GetResponsePrototype(\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_58,
             "    const ::$proto_ns$::MethodDescriptor* method) const {\n  GOOGLE_DCHECK_EQ(method->service(), descriptor());\n  switch(method->index()) {\n"
            );
  method._0_4_ = 0;
  while( true ) {
    iVar1 = (int)method;
    iVar2 = ServiceDescriptor::method_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    type = (Descriptor *)ServiceDescriptor::method(this->descriptor_,(int)method);
    if (which == REQUEST) {
      local_c8 = (cpp *)MethodDescriptor::input_type((MethodDescriptor *)type);
    }
    else {
      local_c8 = (cpp *)MethodDescriptor::output_type((MethodDescriptor *)type);
    }
    local_78 = local_c8;
    QualifiedClassName_abi_cxx11_
              (&local_98,local_c8,(Descriptor *)this->options_,(Options *)local_c8);
    Formatter::operator()
              ((Formatter *)local_58,"    case $1$:\n      return $2$::default_instance();\n",
               (int *)&method,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    method._0_4_ = (int)method + 1;
  }
  local_a0 = "output";
  if (which == REQUEST) {
    local_a0 = "input";
  }
  Formatter::operator()
            ((Formatter *)local_58,
             "    default:\n      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n      return *::$proto_ns$::MessageFactory::generated_factory()\n          ->GetPrototype(method->$1$_type());\n  }\n}\n\n"
             ,&local_a0);
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void ServiceGenerator::GenerateGetPrototype(RequestOrResponse which,
                                            io::Printer* printer) {
  Formatter format(printer, vars_);
  if (which == REQUEST) {
    format("const ::$proto_ns$::Message& $classname$::GetRequestPrototype(\n");
  } else {
    format("const ::$proto_ns$::Message& $classname$::GetResponsePrototype(\n");
  }

  format(
      "    const ::$proto_ns$::MethodDescriptor* method) const {\n"
      "  GOOGLE_DCHECK_EQ(method->service(), descriptor());\n"
      "  switch(method->index()) {\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    const Descriptor* type =
        (which == REQUEST) ? method->input_type() : method->output_type();

    format(
        "    case $1$:\n"
        "      return $2$::default_instance();\n",
        i, QualifiedClassName(type, options_));
  }

  format(
      "    default:\n"
      "      GOOGLE_LOG(FATAL) << \"Bad method index; this should never happen.\";\n"
      "      return *::$proto_ns$::MessageFactory::generated_factory()\n"
      "          ->GetPrototype(method->$1$_type());\n"
      "  }\n"
      "}\n"
      "\n",
      which == REQUEST ? "input" : "output");
}